

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandPrintMint(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint nvars;
  void *pvVar1;
  bool bVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  char *pcVar6;
  ulong uVar7;
  
  pAVar4 = Abc_FrameReadNtk(pAbc);
  bVar2 = false;
  Extra_UtilGetoptReset();
  while (iVar3 = Extra_UtilGetopt(argc,argv,"svwh"), iVar3 == 0x76) {
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (iVar3 == -1) {
    if (pAVar4 == (Abc_Ntk_t *)0x0) {
      pcVar6 = "Empty network.\n";
    }
    else if (pAVar4->ntkType == ABC_NTK_STRASH) {
      pcVar6 = "This command works only for logic networks (run \"clp\").\n";
    }
    else {
      if (pAVar4->ntkFunc == ABC_FUNC_BDD) {
        pVVar5 = pAVar4->vObjs;
        if (0 < pVVar5->nSize) {
          uVar7 = 0;
          do {
            pvVar1 = pVVar5->pArray[uVar7];
            if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 7)) {
              nvars = *(uint *)((long)pvVar1 + 0x1c);
              Cudd_CountMinterm((DdManager *)pAVar4->pManFunc,*(DdNode **)((long)pvVar1 + 0x38),
                                nvars);
              printf("ObjId %3d : SuppSize = %5d   MintCount = %32.0f\n",uVar7 & 0xffffffff,
                     (ulong)nvars);
            }
            uVar7 = uVar7 + 1;
            pVVar5 = pAVar4->vObjs;
          } while ((long)uVar7 < (long)pVVar5->nSize);
        }
        return 0;
      }
      pcVar6 = 
      "This command works only for logic networks with local functions represented by BDDs.\n";
    }
    iVar3 = -1;
  }
  else {
    Abc_Print(-2,"usage: print_mint [-svwh]\n");
    Abc_Print(-2,"\t        prints the number of on-set minterms in the PO functions\n");
    pcVar6 = "yes";
    if (!bVar2) {
      pcVar6 = "no";
    }
    Abc_Print(-2,"\t-v    : enable verbose output [default = %s].\n",pcVar6);
    pcVar6 = "\t-h    : print the command usage\n";
    iVar3 = -2;
  }
  Abc_Print(iVar3,pcVar6);
  return 1;
}

Assistant:

int Abc_CommandPrintMint( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pObj;
    int c;
    int fVerbose;

    // set defaults
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "svwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for logic networks (run \"clp\").\n" );
        return 1;
    }
    if ( !Abc_NtkHasBdd(pNtk) )
    {
        Abc_Print( -1, "This command works only for logic networks with local functions represented by BDDs.\n" );
        return 1;
    }
    Abc_NtkForEachNode( pNtk, pObj, c )
        printf( "ObjId %3d : SuppSize = %5d   MintCount = %32.0f\n", c, Abc_ObjFaninNum(pObj), 
            Cudd_CountMinterm((DdManager *)pNtk->pManFunc, (DdNode *)pObj->pData, Abc_ObjFaninNum(pObj)) );
    return 0;

usage:
    Abc_Print( -2, "usage: print_mint [-svwh]\n" );
    Abc_Print( -2, "\t        prints the number of on-set minterms in the PO functions\n" );
    Abc_Print( -2, "\t-v    : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}